

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

ExpressionResultBuilder * __thiscall
Catch::ExpressionLhs<std::__cxx11::string_const&>::
captureExpression<(Catch::Internal::Operator)0,char[5]>
          (ExpressionLhs<std::__cxx11::string_const&> *this,char (*rhs) [5])

{
  bool result;
  ExpressionResultBuilder *pEVar1;
  char *__s;
  char *value;
  allocator<char> local_89;
  string local_88;
  string local_68;
  string local_38;
  Catch *local_18;
  char (*rhs_local) [5];
  ExpressionLhs<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *this_local;
  
  local_18 = (Catch *)rhs;
  rhs_local = (char (*) [5])this;
  result = Internal::compare<(Catch::Internal::Operator)0,std::__cxx11::string,char[5]>
                     (*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                       (this + 0x228),rhs);
  pEVar1 = ExpressionResultBuilder::setResultType((ExpressionResultBuilder *)this,result);
  toString(&local_38,*(string **)(this + 0x228));
  pEVar1 = ExpressionResultBuilder::setLhs(pEVar1,&local_38);
  toString_abi_cxx11_(&local_68,local_18,value);
  pEVar1 = ExpressionResultBuilder::setRhs(pEVar1,&local_68);
  __s = Internal::OperatorTraits<(Catch::Internal::Operator)0>::getName();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,__s,&local_89);
  pEVar1 = ExpressionResultBuilder::setOp(pEVar1,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_38);
  return pEVar1;
}

Assistant:

ExpressionResultBuilder& captureExpression( const RhsT& rhs ) {
        return m_result
            .setResultType( Internal::compare<Op>( m_lhs, rhs ) )
            .setLhs( Catch::toString( m_lhs ) )
            .setRhs( Catch::toString( rhs ) )
            .setOp( Internal::OperatorTraits<Op>::getName() );
    }